

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O2

void __thiscall MxxSort_Unique_Test::MxxSort_Unique_Test(MxxSort_Unique_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00141ff0;
  return;
}

Assistant:

TEST(MxxSort, Unique) {
    mxx::comm c;
    std::vector<int> vec(100);
    std::srand(13*c.rank());
    int i = 0;
    std::generate(vec.begin(), vec.end(), [&i](){return i++ % 10;});
    mxx::sort(vec.begin(), vec.end());
    std::vector<int>::iterator newend = mxx::unique(vec.begin(), vec.end());
    std::vector<int> unique_els(vec.begin(), newend);

    std::vector<int> all = mxx::allgatherv(unique_els);
    ASSERT_EQ(10ul, all.size());
    for (size_t i = 0; i < all.size(); ++i) {
        ASSERT_EQ((int)i, all[i]);
    }
}